

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wi_stuff.cpp
# Opt level: O2

void __thiscall FPatchInfo::Init(FPatchInfo *this,FGIFont *gifont)

{
  EColorRange EVar1;
  FTexture *pFVar2;
  FFont *pFVar3;
  FName local_14;
  
  if ((gifont->color).Index == 1) {
    pFVar2 = FTextureManager::operator[]
                       (&TexMan,FName::NameData.NameArray[(gifont->fontname).Index].Text);
    this->mPatch = pFVar2;
    this->mColor = -(uint)(pFVar2 != (FTexture *)0x0) | CR_UNTRANSLATED;
    this->mFont = (FFont *)0x0;
  }
  else {
    pFVar3 = V_GetFont(FName::NameData.NameArray[(gifont->fontname).Index].Text);
    this->mFont = pFVar3;
    EVar1 = V_FindFontColor(&local_14);
    this->mColor = EVar1;
    this->mPatch = (FTexture *)0x0;
    if (this->mFont != (FFont *)0x0) {
      return;
    }
  }
  this->mFont = BigFont;
  return;
}

Assistant:

void Init(FGIFont &gifont)
	{
		if (gifont.color == NAME_Null)
		{
			mPatch = TexMan[gifont.fontname];	// "entering"
			mColor = mPatch == NULL? CR_UNTRANSLATED : CR_UNDEFINED;
			mFont = NULL;
		}
		else
		{
			mFont = V_GetFont(gifont.fontname);
			mColor = V_FindFontColor(gifont.color);
			mPatch = NULL;
		}
		if (mFont == NULL)
		{
			mFont = BigFont;
		}
	}